

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain_finite.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  _Setprecision _Var1;
  ostream *poVar2;
  invalid_argument *piVar3;
  undefined8 *in_RSI;
  double dVar4;
  double s;
  double e;
  double f;
  double t;
  finite solver;
  options opt;
  tuple<double,_double,_double> *in_stack_fffffffffffffea8;
  finite *in_stack_fffffffffffffeb0;
  ostream *in_stack_fffffffffffffeb8;
  options *in_stack_fffffffffffffec0;
  double local_88;
  double in_stack_ffffffffffffff80;
  finite *in_stack_ffffffffffffff88;
  double local_70;
  finite local_60;
  uint local_38;
  double local_30;
  double local_28;
  double local_20;
  byte local_18;
  undefined8 *local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  options::options(in_stack_fffffffffffffec0,(uint)((ulong)in_stack_fffffffffffffeb8 >> 0x20),
                   (char **)in_stack_fffffffffffffeb0);
  if ((local_18 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar2 = std::operator<<(poVar2,(char *)*local_10);
    poVar2 = std::operator<<(poVar2," L T\n");
    poVar2 = std::operator<<(poVar2,"       ");
    poVar2 = std::operator<<(poVar2,(char *)*local_10);
    std::operator<<(poVar2," L Tmin Tmax dT\n");
    local_4 = 0x7f;
  }
  else {
    if (local_28 < local_30) {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar3,"Tmax should be larger than Tmin");
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    if (local_20 <= 0.0) {
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar3,"dT should be positive");
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"# L = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_38);
    dVar4 = (double)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    afh::free_energy::chain::finite::finite(&local_60,dVar4);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,std::scientific);
    _Var1 = std::setprecision(0xb);
    std::operator<<(poVar2,_Var1);
    poVar2 = std::operator<<((ostream *)&std::cout,"# ground state energy/L: ");
    dVar4 = afh::free_energy::chain::finite::gs_energy(in_stack_fffffffffffffeb0);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    poVar2 = std::operator<<((ostream *)&std::cout,"# first excitation gap: ");
    dVar4 = afh::free_energy::chain::finite::gap(in_stack_fffffffffffffeb0);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar4);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::operator<<((ostream *)&std::cout,"# [T] [free energy/L] [energy/L] [entropy/L]\n");
    for (local_70 = local_30; dVar4 = local_20 * 0.0001 + local_28, local_70 < dVar4;
        local_70 = local_20 + local_70) {
      afh::free_energy::chain::finite::free_energy
                (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      std::tie<double,double,double>
                ((double *)in_stack_fffffffffffffeb8,(double *)in_stack_fffffffffffffeb0,
                 (double *)in_stack_fffffffffffffea8);
      std::tuple<double&,double&,double&>::operator=
                ((tuple<double_&,_double_&,_double_&> *)in_stack_fffffffffffffeb0,
                 in_stack_fffffffffffffea8);
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_70);
      poVar2 = std::operator<<(poVar2,' ');
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(double)in_stack_ffffffffffffff88);
      poVar2 = std::operator<<(poVar2,' ');
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_stack_ffffffffffffff80);
      in_stack_fffffffffffffeb8 = std::operator<<(poVar2,' ');
      in_stack_fffffffffffffeb0 =
           (finite *)std::ostream::operator<<(in_stack_fffffffffffffeb8,local_88);
      std::ostream::operator<<
                ((ostream *)in_stack_fffffffffffffeb0,std::endl<char,std::char_traits<char>>);
    }
    afh::free_energy::chain::finite::~finite(&local_60,dVar4);
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
  options opt(argc, argv);
  if (!opt.valid) {
    std::cerr << "Usage: " << argv[0] << " L T\n"
              << "       " << argv[0] << " L Tmin Tmax dT\n";
    return 127;
  }
  if (opt.Tmin > opt.Tmax) throw(std::invalid_argument("Tmax should be larger than Tmin"));
  if (opt.dT <= 0) throw(std::invalid_argument("dT should be positive"));
  std::cout << "# L = " << opt.L << std::endl;

  afh::free_energy::chain::finite solver(opt.L);
  std::cout << std::scientific << std::setprecision(11);
  std::cout << "# ground state energy/L: " << solver.gs_energy() << std::endl;
  std::cout << "# first excitation gap: " << solver.gap() << std::endl;

  std::cout << "# [T] [free energy/L] [energy/L] [entropy/L]\n";
  for (auto t = opt.Tmin; t < opt.Tmax + 1e-4 * opt.dT; t += opt.dT) {
    double f, e, s;
    std::tie(f, e, s) = solver.free_energy(t);
    std::cout << t << ' ' << f << ' ' << e << ' ' << s << std::endl;
  }
}